

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O2

int dwarf_get_ISA_name(uint val,char **s_out)

{
  if (val < 3) {
    *s_out = &DAT_0019f8d4 + *(int *)(&DAT_0019f8d4 + (ulong)val * 4);
    return 0;
  }
  return -1;
}

Assistant:

int
dwarf_get_ISA_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_ISA_UNKNOWN:
        *s_out = "DW_ISA_UNKNOWN";
        return DW_DLV_OK;
    case DW_ISA_ARM_thumb:
        *s_out = "DW_ISA_ARM_thumb";
        return DW_DLV_OK;
    case DW_ISA_ARM_arm:
        *s_out = "DW_ISA_ARM_arm";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}